

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O2

void __thiscall
TextReaderTest_ReadTillEndOfLine_Test::TestBody(TextReaderTest_ReadTillEndOfLine_Test *this)

{
  bool bVar1;
  char *message;
  NLStringRef data;
  AssertHelper AStack_a8;
  AssertionResult gtest_ar;
  string gtest_expected_message;
  TextReader reader;
  
  data.size_ = 0xb;
  data.data_ = "ab cde\nfg h";
  mp::internal::TextReader<fmt::Locale>::TextReader(&reader,data,(CStringRef)0x22c559);
  mp::internal::TextReader<fmt::Locale>::ReadTillEndOfLine(&reader);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gtest_expected_message,"test:2:5: expected newline",
               (allocator<char> *)&AStack_a8);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::internal::TextReader<fmt::Locale>::ReadTillEndOfLine(&reader);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [109])
               "Expected: reader.ReadTillEndOfLine() throws an exception of type mp::ReadError.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    message = "";
  }
  else {
    message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&AStack_a8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x7e,message);
  testing::internal::AssertHelper::operator=(&AStack_a8,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper(&AStack_a8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  mp::internal::TextReader<fmt::Locale>::~TextReader(&reader);
  return;
}

Assistant:

TEST(TextReaderTest, ReadTillEndOfLine) {
  TextReader reader("ab cde\nfg h", "test");
  reader.ReadTillEndOfLine();
  EXPECT_THROW_MSG(reader.ReadTillEndOfLine(), mp::ReadError,
                   "test:2:5: expected newline");
}